

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

string * __thiscall
Json::OurReader::getLocationLineAndColumn_abi_cxx11_
          (string *__return_storage_ptr__,OurReader *this,Location location)

{
  allocator<char> local_69;
  char local_68 [8];
  char buffer [51];
  uint local_28;
  uint local_24;
  int column;
  int line;
  Location location_local;
  OurReader *this_local;
  
  _column = location;
  location_local = (Location)this;
  this_local = (OurReader *)__return_storage_ptr__;
  getLocationLineAndColumn(this,location,(int *)&local_24,(int *)&local_28);
  snprintf(local_68,0x33,"Line %d, Column %d",(ulong)local_24,(ulong)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_68,&local_69);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING OurReader::getLocationLineAndColumn(Location location) const {
  int line, column;
  getLocationLineAndColumn(location, line, column);
  char buffer[18 + 16 + 16 + 1];
  snprintf(buffer, sizeof(buffer), "Line %d, Column %d", line, column);
  return buffer;
}